

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O0

void __thiscall
capnp::InputStreamMessageReader::InputStreamMessageReader
          (InputStreamMessageReader *this,InputStream *inputStream,ReaderOptions options,
          ArrayPtr<capnp::word> scratchSpace)

{
  bool bVar1;
  uint uVar2;
  kj *this_00;
  DirectWireValue<unsigned_int> *pDVar3;
  WiderType<Decay<unsigned_int_&>,_Decay<unsigned_long_&>_> WVar4;
  size_t sVar5;
  ArrayPtr<const_capnp::word> *pAVar6;
  uchar *puVar7;
  ssize_t sVar8;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  ArrayPtr<capnp::_::DirectWireValue<unsigned_int>_> AVar9;
  ArrayPtr<unsigned_char> AVar10;
  ArrayPtr<capnp::word> AVar11;
  ArrayPtr<const_capnp::word> AVar12;
  ReaderOptions options_00;
  uint local_2b8;
  ArrayPtr<unsigned_char> local_260;
  ArrayPtr<capnp::word> local_250;
  ArrayPtr<unsigned_char> local_240;
  ArrayPtr<capnp::word> local_230;
  ArrayPtr<const_capnp::word> local_220;
  uint local_210;
  uint local_20c;
  uint segmentSize;
  uint i_1;
  size_t offset;
  ArrayPtr<capnp::word> local_1e8;
  ArrayPtr<const_capnp::word> local_1d8;
  ArrayPtr<capnp::word> local_1c8;
  Array<capnp::word> local_1b8;
  Fault local_1a0;
  Fault f_1;
  undefined1 local_190 [8];
  DebugComparison<unsigned_long_&,_unsigned_long_&> _kjCondition_1;
  uint i;
  undefined1 local_150 [8];
  ArrayPtr<capnp::_::DirectWireValue<unsigned_int>_> moreSizes;
  Array<capnp::_::DirectWireValue<unsigned_int>_> moreSizes_heap;
  WireValue<uint32_t> moreSizes_stack [16];
  bool moreSizes_isOnStack;
  size_t moreSizes_size;
  Fault f;
  uint *local_c0;
  undefined1 local_b8 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition;
  size_t totalWords;
  uint segment0Size;
  uint segmentCount;
  size_t local_78;
  ArrayPtr<unsigned_char> local_70;
  DirectWireValue<unsigned_int> local_5c;
  DirectWireValue<unsigned_int> local_58;
  WireValue<uint32_t> firstWord [2];
  InputStream *inputStream_local;
  InputStreamMessageReader *this_local;
  ArrayPtr<capnp::word> scratchSpace_local;
  ReaderOptions options_local;
  
  scratchSpace_local.ptr = (word *)scratchSpace.size_;
  this_local = (InputStreamMessageReader *)scratchSpace.ptr;
  scratchSpace_local.size_ = options.traversalLimitInWords;
  options_00._12_4_ = 0;
  options_00.traversalLimitInWords = SUB128(options._0_12_,0);
  options_00.nestingLimit = SUB124(options._0_12_,8);
  MessageReader::MessageReader(&this->super_MessageReader,options_00);
  (this->super_MessageReader)._vptr_MessageReader =
       (_func_int **)&PTR__InputStreamMessageReader_004c61f8;
  this->inputStream = inputStream;
  this->readPos = (byte *)0x0;
  kj::ArrayPtr<const_capnp::word>::ArrayPtr(&this->segment0);
  kj::Array<kj::ArrayPtr<const_capnp::word>_>::Array(&this->moreSegments);
  kj::Array<capnp::word>::Array(&this->ownedSpace);
  kj::UnwindDetector::UnwindDetector(&this->unwindDetector);
  _segment0Size =
       kj::arrayPtr<capnp::_::DirectWireValue<unsigned_int>,2ul>
                 ((DirectWireValue<unsigned_int> (*) [2])&local_5c);
  local_70 = kj::ArrayPtr<capnp::_::DirectWireValue<unsigned_int>_>::asBytes
                       ((ArrayPtr<capnp::_::DirectWireValue<unsigned_int>_> *)&segment0Size);
  kj::InputStream::read(inputStream,(int)local_70.ptr,(void *)local_70.size_,(size_t)local_70.ptr);
  uVar2 = capnp::_::DirectWireValue<unsigned_int>::get(&local_5c);
  totalWords._4_4_ = uVar2 + 1;
  if (totalWords._4_4_ == 0) {
    local_2b8 = 0;
  }
  else {
    local_2b8 = capnp::_::DirectWireValue<unsigned_int>::get(&local_58);
  }
  totalWords._0_4_ = local_2b8;
  _kjCondition._32_8_ = ZEXT48(local_2b8);
  local_c0 = (uint *)kj::_::DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                (uint *)((long)&totalWords + 4));
  f.exception._4_4_ = 0x200;
  kj::_::DebugExpression<unsigned_int&>::operator<
            ((DebugComparison<unsigned_int_&,_int> *)local_b8,
             (DebugExpression<unsigned_int&> *)&local_c0,(int *)((long)&f.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_b8);
  sVar5 = extraout_RDX;
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,int>&,char_const(&)[31]>
              ((Fault *)&moreSizes_size,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize.c++"
               ,0xb5,FAILED,"segmentCount < 512","_kjCondition,\"Message has too many segments.\"",
               (DebugComparison<unsigned_int_&,_int> *)local_b8,
               (char (*) [31])"Message has too many segments.");
    totalWords._4_4_ = 1;
    totalWords._0_4_ = 1;
    kj::_::Debug::Fault::~Fault((Fault *)&moreSizes_size);
    sVar5 = extraout_RDX_00;
  }
  this_00 = (kj *)(ulong)(totalWords._4_4_ & 0xfffffffe);
  if (this_00 < (kj *)0x11) {
    kj::Array<capnp::_::DirectWireValue<unsigned_int>_>::Array
              ((Array<capnp::_::DirectWireValue<unsigned_int>_> *)&moreSizes.size_,(void *)0x0);
    AVar9 = kj::arrayPtr<capnp::_::DirectWireValue<unsigned_int>>
                      ((DirectWireValue<unsigned_int> *)&moreSizes_heap.disposer,(size_t)this_00);
  }
  else {
    kj::heapArray<capnp::_::DirectWireValue<unsigned_int>>
              ((Array<capnp::_::DirectWireValue<unsigned_int>_> *)&moreSizes.size_,this_00,sVar5);
    AVar9 = kj::Array::operator_cast_to_ArrayPtr((Array *)&moreSizes.size_);
  }
  moreSizes.ptr = (DirectWireValue<unsigned_int> *)AVar9.size_;
  local_150 = (undefined1  [8])AVar9.ptr;
  if (1 < totalWords._4_4_) {
    AVar10 = kj::ArrayPtr<capnp::_::DirectWireValue<unsigned_int>_>::asBytes
                       ((ArrayPtr<capnp::_::DirectWireValue<unsigned_int>_> *)local_150);
    kj::InputStream::read(inputStream,(int)AVar10.ptr,(void *)AVar10.size_,(size_t)AVar10.ptr);
    for (_kjCondition_1._36_4_ = 0; AVar9.size_ = (size_t)moreSizes.ptr,
        AVar9.ptr = (DirectWireValue<unsigned_int> *)local_150,
        (uint)_kjCondition_1._36_4_ < totalWords._4_4_ - 1;
        _kjCondition_1._36_4_ = _kjCondition_1._36_4_ + 1) {
      pDVar3 = kj::ArrayPtr<capnp::_::DirectWireValue<unsigned_int>_>::operator[]
                         ((ArrayPtr<capnp::_::DirectWireValue<unsigned_int>_> *)local_150,
                          (ulong)(uint)_kjCondition_1._36_4_);
      uVar2 = capnp::_::DirectWireValue<unsigned_int>::get(pDVar3);
      _kjCondition._32_8_ = (ulong)uVar2 + _kjCondition._32_8_;
    }
  }
  moreSizes.ptr = (DirectWireValue<unsigned_int> *)AVar9.size_;
  local_150 = (undefined1  [8])AVar9.ptr;
  f_1.exception =
       (Exception *)
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(unsigned_long *)&_kjCondition.result
                 );
  kj::_::DebugExpression<unsigned_long&>::operator<=
            ((DebugComparison<unsigned_long_&,_unsigned_long_&> *)local_190,
             (DebugExpression<unsigned_long&> *)&f_1,&scratchSpace_local.size_);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_190);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&,char_const(&)[93]>
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize.c++"
               ,0xc9,FAILED,"totalWords <= options.traversalLimitInWords",
               "_kjCondition,\"Message is too large.  To increase the limit on the receiving end, see \" \"capnp::ReaderOptions.\""
               ,(DebugComparison<unsigned_long_&,_unsigned_long_&> *)local_190,
               (char (*) [93])
               "Message is too large.  To increase the limit on the receiving end, see capnp::ReaderOptions."
              );
    totalWords._4_4_ = 1;
    WVar4 = kj::min<unsigned_int&,unsigned_long&>((uint *)&totalWords,&scratchSpace_local.size_);
    totalWords._0_4_ = (uint)WVar4;
    _kjCondition._32_8_ = WVar4 & 0xffffffff;
    kj::_::Debug::Fault::~Fault(&local_1a0);
  }
  sVar5 = kj::ArrayPtr<capnp::word>::size((ArrayPtr<capnp::word> *)&this_local);
  AVar11.size_ = (size_t)scratchSpace_local.ptr;
  AVar11.ptr = (word *)this_local;
  if (sVar5 < (ulong)_kjCondition._32_8_) {
    kj::heapArray<capnp::word>(&local_1b8,_kjCondition._32_8_);
    kj::Array<capnp::word>::operator=(&this->ownedSpace,&local_1b8);
    kj::Array<capnp::word>::~Array(&local_1b8);
    local_1c8 = kj::Array::operator_cast_to_ArrayPtr((Array *)&this->ownedSpace);
    AVar11 = local_1c8;
  }
  scratchSpace_local.ptr = (word *)AVar11.size_;
  this_local = (InputStreamMessageReader *)AVar11.ptr;
  local_1e8 = kj::ArrayPtr<capnp::word>::first
                        ((ArrayPtr<capnp::word> *)&this_local,(ulong)(uint)totalWords);
  local_1d8 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&local_1e8);
  this->segment0 = local_1d8;
  if (1 < totalWords._4_4_) {
    kj::heapArray<kj::ArrayPtr<capnp::word_const>>
              ((Array<kj::ArrayPtr<const_capnp::word>_> *)&offset,
               (kj *)(ulong)(totalWords._4_4_ - 1),(size_t)local_1d8.ptr);
    kj::Array<kj::ArrayPtr<const_capnp::word>_>::operator=
              (&this->moreSegments,(Array<kj::ArrayPtr<const_capnp::word>_> *)&offset);
    kj::Array<kj::ArrayPtr<const_capnp::word>_>::~Array
              ((Array<kj::ArrayPtr<const_capnp::word>_> *)&offset);
    _segmentSize = (ulong)(uint)totalWords;
    for (local_20c = 0; local_20c < totalWords._4_4_ - 1; local_20c = local_20c + 1) {
      pDVar3 = kj::ArrayPtr<capnp::_::DirectWireValue<unsigned_int>_>::operator[]
                         ((ArrayPtr<capnp::_::DirectWireValue<unsigned_int>_> *)local_150,
                          (ulong)local_20c);
      local_210 = capnp::_::DirectWireValue<unsigned_int>::get(pDVar3);
      AVar11 = kj::ArrayPtr<capnp::word>::slice
                         ((ArrayPtr<capnp::word> *)&this_local,_segmentSize,_segmentSize + local_210
                         );
      local_230 = AVar11;
      AVar12 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&local_230);
      local_220 = AVar12;
      pAVar6 = kj::Array<kj::ArrayPtr<const_capnp::word>_>::operator[]
                         (&this->moreSegments,(ulong)local_20c);
      *pAVar6 = local_220;
      _segmentSize = local_210 + _segmentSize;
    }
  }
  if (totalWords._4_4_ == 1) {
    local_250 = kj::ArrayPtr<capnp::word>::first
                          ((ArrayPtr<capnp::word> *)&this_local,_kjCondition._32_8_);
    local_240 = kj::ArrayPtr<capnp::word>::asBytes(&local_250);
    kj::InputStream::read
              (inputStream,(int)local_240.ptr,(void *)local_240.size_,(size_t)local_240.ptr);
  }
  else {
    if (1 < totalWords._4_4_) {
      local_260 = kj::ArrayPtr<capnp::word>::asBytes((ArrayPtr<capnp::word> *)&this_local);
      puVar7 = kj::ArrayPtr<unsigned_char>::begin(&local_260);
      this->readPos = puVar7;
      AVar10 = kj::arrayPtr<unsigned_char>(this->readPos,_kjCondition._32_8_ << 3);
      sVar8 = kj::InputStream::read
                        (inputStream,(int)AVar10.ptr,(void *)AVar10.size_,
                         (ulong)(uint)totalWords << 3);
      this->readPos = this->readPos + sVar8;
    }
  }
  kj::Array<capnp::_::DirectWireValue<unsigned_int>_>::~Array
            ((Array<capnp::_::DirectWireValue<unsigned_int>_> *)&moreSizes.size_);
  return;
}

Assistant:

InputStreamMessageReader::InputStreamMessageReader(
    kj::InputStream& inputStream, ReaderOptions options, kj::ArrayPtr<word> scratchSpace)
    : MessageReader(options), inputStream(inputStream), readPos(nullptr) {
  _::WireValue<uint32_t> firstWord[2];

  inputStream.read(kj::arrayPtr(firstWord).asBytes());

  uint segmentCount = firstWord[0].get() + 1;
  uint segment0Size = segmentCount == 0 ? 0 : firstWord[1].get();

  size_t totalWords = segment0Size;

  // Reject messages with too many segments for security reasons.
  KJ_REQUIRE(segmentCount < 512, "Message has too many segments.") {
    segmentCount = 1;
    segment0Size = 1;
    break;
  }

  // Read sizes for all segments except the first.  Include padding if necessary.
  KJ_STACK_ARRAY(_::WireValue<uint32_t>, moreSizes, segmentCount & ~1, 16, 64);
  if (segmentCount > 1) {
    inputStream.read(moreSizes.asBytes());
    for (uint i = 0; i < segmentCount - 1; i++) {
      totalWords += moreSizes[i].get();
    }
  }

  // Don't accept a message which the receiver couldn't possibly traverse without hitting the
  // traversal limit.  Without this check, a malicious client could transmit a very large segment
  // size to make the receiver allocate excessive space and possibly crash.
  KJ_REQUIRE(totalWords <= options.traversalLimitInWords,
             "Message is too large.  To increase the limit on the receiving end, see "
             "capnp::ReaderOptions.") {
    segmentCount = 1;
    segment0Size = kj::min(segment0Size, options.traversalLimitInWords);
    totalWords = segment0Size;
    break;
  }

  if (scratchSpace.size() < totalWords) {
    // TODO(perf):  Consider allocating each segment as a separate chunk to reduce memory
    //   fragmentation.
    ownedSpace = kj::heapArray<word>(totalWords);
    scratchSpace = ownedSpace;
  }

  segment0 = scratchSpace.first(segment0Size);

  if (segmentCount > 1) {
    moreSegments = kj::heapArray<kj::ArrayPtr<const word>>(segmentCount - 1);
    size_t offset = segment0Size;

    for (uint i = 0; i < segmentCount - 1; i++) {
      uint segmentSize = moreSizes[i].get();
      moreSegments[i] = scratchSpace.slice(offset, offset + segmentSize);
      offset += segmentSize;
    }
  }

  if (segmentCount == 1) {
    inputStream.read(scratchSpace.first(totalWords).asBytes());
  } else if (segmentCount > 1) {
    readPos = scratchSpace.asBytes().begin();
    readPos += inputStream.read(kj::arrayPtr(readPos, totalWords * sizeof(word)), segment0Size * sizeof(word));
  }
}